

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  bool bVar4;
  char *digits;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  size_t __len;
  char *pcVar9;
  
  lVar2 = *(long *)(this + 0x10);
  if (lVar2 != 0) {
    lVar3 = *(long *)(this + 8);
    pcVar9 = *it;
    lVar6 = 0;
    do {
      pcVar9[lVar6] = *(char *)(lVar3 + lVar6);
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
    *it = pcVar9 + lVar6;
  }
  pcVar7 = *it;
  __n = *(size_t *)(this + 0x20);
  pcVar9 = pcVar7;
  if (__n != 0) {
    pcVar9 = pcVar7 + __n;
    switchD_0105b559::default(pcVar7,*(int *)(this + 0x18),__n);
  }
  *it = pcVar9;
  iVar1 = *(int *)(this + 0x30);
  if (*(char *)(*(long *)(*(long *)(this + 0x28) + 8) + 8) == 'x') {
    pcVar5 = "0123456789abcdef";
  }
  else {
    pcVar5 = "0123456789ABCDEF";
  }
  pcVar7 = pcVar7 + __n + (long)iVar1;
  uVar8 = *(uint *)(*(long *)(this + 0x28) + 0x10);
  do {
    pcVar7 = pcVar7 + -1;
    *pcVar7 = pcVar5[uVar8 & 0xf];
    bVar4 = 0xf < uVar8;
    uVar8 = uVar8 >> 4;
  } while (bVar4);
  *it = pcVar9 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }